

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_peobj.c
# Opt level: O3

void emit_peobj_sym_sect(BuildCtx *ctx,PEsection *pesect,int sect)

{
  PEsym sym;
  PEsymaux aux;
  undefined8 local_40;
  undefined4 local_38;
  short local_34;
  undefined4 local_32;
  uint32_t local_2c;
  ulong local_28;
  undefined8 uStack_20;
  
  if (strtab != (char *)0x0) {
    local_40 = *(undefined8 *)pesect[(uint)sect].name;
    local_38 = 0;
    local_34 = (short)sect + 1;
    local_32 = 0x1030000;
    owrite(ctx,&local_40,0x12);
    uStack_20 = 0;
    local_2c = pesect[(uint)sect].size;
    local_28 = (ulong)pesect[(uint)sect].nreloc;
    owrite(ctx,&local_2c,0x12);
  }
  return;
}

Assistant:

static void emit_peobj_sym_sect(BuildCtx *ctx, PEsection *pesect, int sect)
{
  PEsym sym;
  PEsymaux aux;
  if (!strtab) return;  /* Pass 1: no output. */
  memcpy(sym.n.name, pesect[sect].name, 8);
  sym.value = 0;
  sym.sect = (int16_t)(sect+1);  /* 1-based section number. */
  sym.type = PEOBJ_TYPE_NULL;
  sym.scl = PEOBJ_SCL_STATIC;
  sym.naux = 1;
  owrite(ctx, &sym, PEOBJ_SYM_SIZE);
  memset(&aux, 0, sizeof(PEsymaux));
  aux.size = pesect[sect].size;
  aux.nreloc = pesect[sect].nreloc;
  owrite(ctx, &aux, PEOBJ_SYM_SIZE);
}